

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_io_stripASCIIForCompare_63(char *dst,char *name)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  char *dstItr;
  bool bVar4;
  byte bVar5;
  
  pcVar2 = dst;
  bVar3 = *name;
  if (bVar3 == 0) {
LAB_0033a13d:
    *dst = 0;
    return pcVar2;
  }
  bVar1 = false;
LAB_0033a0c9:
  bVar4 = !bVar1;
  do {
    name = (char *)((byte *)name + 1);
    if ((char)bVar3 < '\0') {
      bVar5 = 0;
    }
    else {
      bVar5 = ""[bVar3];
    }
    if (bVar5 != 0) {
      bVar1 = true;
      if (bVar5 != 1) {
        if (bVar5 != 2) {
          bVar1 = false;
          bVar3 = bVar5;
        }
        goto LAB_0033a132;
      }
      if (!bVar4) goto LAB_0033a132;
      if (((long)*name < 0) || (1 < ""[*name] - 1)) goto LAB_0033a12f;
    }
    bVar3 = *name;
    bVar4 = true;
  } while (bVar3 != 0);
  goto LAB_0033a13d;
LAB_0033a12f:
  bVar1 = false;
LAB_0033a132:
  *dst = bVar3;
  dst = (char *)((byte *)dst + 1);
  bVar3 = *name;
  if (bVar3 == 0) goto LAB_0033a13d;
  goto LAB_0033a0c9;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripASCIIForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_ASCII_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_ASCII_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}